

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::DlbaEncoder::BeginWrite<double>
          (DlbaEncoder *this,Allocator *param_2,WriteStream *param_3,double *param_4)

{
  InternalException *this_00;
  allocator local_41;
  string local_40 [64];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"DlbaEncoder should only be used with strings",&local_41);
  duckdb::InternalException::InternalException(this_00,local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void BeginWrite(Allocator &, WriteStream &, const T &) {
		throw InternalException("DlbaEncoder should only be used with strings");
	}